

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O1

int libssh2_channel_request_auth_agent(LIBSSH2_CHANNEL *channel)

{
  int iVar1;
  time_t tVar2;
  
  if (channel == (LIBSSH2_CHANNEL *)0x0) {
    return -0x27;
  }
  iVar1 = -0x17;
  if (channel->req_auth_agent_try_state == libssh2_NB_state_idle) {
    tVar2 = time((time_t *)0x0);
    do {
      iVar1 = channel_request_auth_agent(channel,"auth-agent-req@openssh.com",0x1a);
      if (iVar1 != -0x25) break;
      if (channel->session->api_block_mode == 0) {
        iVar1 = -0x25;
        break;
      }
      iVar1 = _libssh2_wait_socket(channel->session,tVar2);
    } while (iVar1 == 0);
    if ((iVar1 != -0x25) && (iVar1 != 0)) {
      channel->req_auth_agent_try_state = libssh2_NB_state_sent;
    }
  }
  if (channel->req_auth_agent_try_state == libssh2_NB_state_sent) {
    tVar2 = time((time_t *)0x0);
    do {
      iVar1 = channel_request_auth_agent(channel,"auth-agent-req",0xe);
      if (iVar1 != -0x25) break;
      if (channel->session->api_block_mode == 0) {
        iVar1 = -0x25;
        break;
      }
      iVar1 = _libssh2_wait_socket(channel->session,tVar2);
    } while (iVar1 == 0);
    if ((iVar1 != -0x25) && (iVar1 != 0)) {
      channel->req_auth_agent_try_state = libssh2_NB_state_sent1;
    }
  }
  if (iVar1 == 0) {
    channel->req_auth_agent_try_state = libssh2_NB_state_idle;
  }
  return iVar1;
}

Assistant:

LIBSSH2_API int
libssh2_channel_request_auth_agent(LIBSSH2_CHANNEL *channel)
{
    int rc;

    if(!channel)
        return LIBSSH2_ERROR_BAD_USE;

    rc = LIBSSH2_ERROR_CHANNEL_UNKNOWN;

    /* The current RFC draft for agent forwarding says you're supposed to
     * send "auth-agent-req," but most SSH servers out there right now
     * actually expect "auth-agent-req@openssh.com", so we try that
     * first. */
    if(channel->req_auth_agent_try_state == libssh2_NB_state_idle) {
        BLOCK_ADJUST(rc, channel->session,
                     channel_request_auth_agent(channel,
                                                "auth-agent-req@openssh.com",
                                                26));

        /* If we failed (but not with EAGAIN), then we move onto
         * the next step to try another request type. */
        if(rc != LIBSSH2_ERROR_NONE &&
           rc != LIBSSH2_ERROR_EAGAIN)
            channel->req_auth_agent_try_state = libssh2_NB_state_sent;
    }

    if(channel->req_auth_agent_try_state == libssh2_NB_state_sent) {
        BLOCK_ADJUST(rc, channel->session,
                     channel_request_auth_agent(channel,
                                                "auth-agent-req", 14));

        /* If we failed without an EAGAIN, then move on with this
         * state machine. */
        if(rc != LIBSSH2_ERROR_NONE &&
           rc != LIBSSH2_ERROR_EAGAIN)
            channel->req_auth_agent_try_state = libssh2_NB_state_sent1;
    }

    /* If things are good, reset the try state. */
    if(rc == LIBSSH2_ERROR_NONE)
        channel->req_auth_agent_try_state = libssh2_NB_state_idle;

    return rc;
}